

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O2

int lj_cf_ffi_abi(lua_State *L)

{
  uint uVar1;
  GCstr *str;
  uint64_t uVar2;
  
  str = lj_lib_checkstr(L,1);
  uVar1 = lj_cparse_case(str,"\x0564bit\x03fpu\x06hardfp\x02le\x04gc64");
  uVar2 = ((ulong)(uVar1 >> 0x1f) << 0x2f) + 0xfffeffffffffffff;
  L->top[-1].u64 = uVar2;
  *(uint64_t *)((L->glref).ptr64 + 0xf0) = uVar2;
  return 1;
}

Assistant:

LJLIB_CF(ffi_abi)	LJLIB_REC(.)
{
  GCstr *s = lj_lib_checkstr(L, 1);
  int b = lj_cparse_case(s,
#if LJ_64
    "\00564bit"
#else
    "\00532bit"
#endif
#if LJ_ARCH_HASFPU
    "\003fpu"
#endif
#if LJ_ABI_SOFTFP
    "\006softfp"
#else
    "\006hardfp"
#endif
#if LJ_ABI_EABI
    "\004eabi"
#endif
#if LJ_ABI_WIN
    "\003win"
#endif
#if LJ_TARGET_UWP
    "\003uwp"
#endif
#if LJ_LE
    "\002le"
#else
    "\002be"
#endif
#if LJ_GC64
    "\004gc64"
#endif
  ) >= 0;
  setboolV(L->top-1, b);
  setboolV(&G(L)->tmptv2, b);  /* Remember for trace recorder. */
  return 1;
}